

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_SUNMemory.cpp
# Opt level: O3

void amrex::sundials::MemoryHelper::Initialize(int nthreads)

{
  SUNMemoryHelper_Ops p_Var1;
  undefined8 *puVar2;
  Context *pCVar3;
  SUNMemoryHelper p_Var4;
  void *pvVar5;
  ulong uVar6;
  
  if (DAT_007182d8 == (anonymous_namespace)::initialized) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::initialized,
               (long)nthreads);
    if ((anonymous_namespace)::initialized != DAT_007182d8) {
      memset((anonymous_namespace)::initialized,0,
             ((long)DAT_007182d8 + (-4 - (long)(anonymous_namespace)::initialized) &
             0xfffffffffffffffcU) + 4);
    }
    std::vector<amrex::sundials::MemoryHelper_*,_std::allocator<amrex::sundials::MemoryHelper_*>_>::
    resize((vector<amrex::sundials::MemoryHelper_*,_std::allocator<amrex::sundials::MemoryHelper_*>_>
            *)&(anonymous_namespace)::the_sunmemory_helper,(long)nthreads);
    if ((anonymous_namespace)::the_sunmemory_helper != DAT_007182f0) {
      memset((anonymous_namespace)::the_sunmemory_helper,0,
             (long)DAT_007182f0 - (long)(anonymous_namespace)::the_sunmemory_helper &
             0xfffffffffffffff8);
    }
  }
  if (0 < nthreads) {
    uVar6 = 0;
    pvVar5 = (anonymous_namespace)::initialized;
    do {
      if (*(int *)((long)pvVar5 + uVar6 * 4) == 0) {
        *(undefined4 *)((long)pvVar5 + uVar6 * 4) = 1;
        puVar2 = (undefined8 *)operator_new(0x10);
        pCVar3 = The_Sundials_Context((int)uVar6);
        *puVar2 = pCVar3;
        p_Var4 = SUNMemoryHelper_NewEmpty
                           (*(pCVar3->sunctx_)._M_t.
                             super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                             ._M_t.
                             super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                             .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
        p_Var4->content = (void *)0x0;
        p_Var1 = p_Var4->ops;
        p_Var1->clone = anon_unknown_0::CloneMemoryHelper;
        p_Var1->alloc = anon_unknown_0::Alloc;
        p_Var1->dealloc = anon_unknown_0::Dealloc;
        p_Var1->destroy = anon_unknown_0::DestroyMemoryHelper;
        puVar2[1] = p_Var4;
        *(undefined8 **)((long)(anonymous_namespace)::the_sunmemory_helper + uVar6 * 8) = puVar2;
        pvVar5 = (anonymous_namespace)::initialized;
      }
      uVar6 = uVar6 + 1;
    } while ((uint)nthreads != uVar6);
  }
  return;
}

Assistant:

void MemoryHelper::Initialize(int nthreads)
{
    if (initialized.size() == 0) {
        initialized.resize(nthreads);
        std::fill(initialized.begin(), initialized.end(), 0);
        the_sunmemory_helper.resize(nthreads);
        std::fill(the_sunmemory_helper.begin(), the_sunmemory_helper.end(), nullptr);
    }
    for (int i = 0; i < nthreads; i++) {
        if (initialized[i]) continue;
        initialized[i] = 1;
        BL_ASSERT(the_sunmemory_helper[i] == nullptr);
        the_sunmemory_helper[i] = new MemoryHelper(The_Sundials_Context(i));
    }
}